

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_tpdf_free(ly_ctx *ctx,lys_tpdf *tpdf)

{
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x7de,"void lys_tpdf_free(struct ly_ctx *, struct lys_tpdf *)");
  }
  if (tpdf != (lys_tpdf *)0x0) {
    lydict_remove(ctx,tpdf->name);
    lydict_remove(ctx,tpdf->dsc);
    lydict_remove(ctx,tpdf->ref);
    lys_type_free(ctx,&tpdf->type);
    lydict_remove(ctx,tpdf->units);
    lydict_remove(ctx,tpdf->dflt);
    lys_extension_instances_free(ctx,tpdf->ext,(uint)tpdf->ext_size);
    return;
  }
  return;
}

Assistant:

static void
lys_tpdf_free(struct ly_ctx *ctx, struct lys_tpdf *tpdf)
{
    assert(ctx);
    if (!tpdf) {
        return;
    }

    lydict_remove(ctx, tpdf->name);
    lydict_remove(ctx, tpdf->dsc);
    lydict_remove(ctx, tpdf->ref);

    lys_type_free(ctx, &tpdf->type);

    lydict_remove(ctx, tpdf->units);
    lydict_remove(ctx, tpdf->dflt);

    lys_extension_instances_free(ctx, tpdf->ext, tpdf->ext_size);
}